

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmatchQbf.cpp
# Opt level: O2

void Bmatch_CreatePOMUXes(Abc_Ntk_t *pNtk1,Abc_Ntk_t *pNtk2,Abc_Ntk_t *pNtk_Qbf)

{
  Abc_Aig_t *pAVar1;
  int iVar2;
  Abc_Obj_t *pAVar3;
  Abc_Obj_t *pAVar4;
  char *pcVar5;
  int iVar6;
  int j;
  ulong uVar7;
  int level;
  vector<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_> Po_Pool;
  Abc_Obj_t *pObjA;
  Abc_Obj_t *pObj;
  Abc_Obj_t *local_48;
  Abc_Obj_t *local_40;
  Abc_Ntk_t *pNtk_Qbf_local;
  
  level = 1;
  Po_Pool.super__Vector_base<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Po_Pool.super__Vector_base<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  Po_Pool.super__Vector_base<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pNtk_Qbf_local = pNtk_Qbf;
  if ((Output_Pool.super__Vector_base<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>._M_impl.
       super__Vector_impl_data._M_finish ==
       Output_Pool.super__Vector_base<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>._M_impl.
       super__Vector_impl_data._M_start) &&
     (Control_Pool.super__Vector_base<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      Control_Pool.super__Vector_base<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>._M_impl.
      super__Vector_impl_data._M_start)) {
    for (iVar6 = 0; iVar6 < pNtk1->vPos->nSize; iVar6 = iVar6 + 1) {
      pAVar3 = Abc_NtkPo(pNtk1,iVar6);
      local_48 = Abc_ObjChild0Copy(pAVar3);
      std::vector<Abc_Obj_t_*,std::allocator<Abc_Obj_t_*>>::emplace_back<Abc_Obj_t_*>
                ((vector<Abc_Obj_t_*,std::allocator<Abc_Obj_t_*>> *)&Po_Pool,&local_48);
    }
    for (iVar6 = 0; iVar2 = pNtk2->vPos->nSize, iVar6 < iVar2; iVar6 = iVar6 + 1) {
      local_40 = Abc_NtkPo(pNtk2,iVar6);
      Bmatch_Construct_MUXes(&Po_Pool,&local_40,&pNtk_Qbf_local,&level,&fConst0);
      level = 1;
    }
    if (Po_Pool.super__Vector_base<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        Po_Pool.super__Vector_base<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>._M_impl.
        super__Vector_impl_data._M_start) {
      Po_Pool.super__Vector_base<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>._M_impl.
      super__Vector_impl_data._M_finish =
           Po_Pool.super__Vector_base<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>._M_impl.
           super__Vector_impl_data._M_start;
    }
    for (iVar6 = 0; iVar6 < iVar2; iVar6 = iVar6 + 1) {
      pAVar4 = Abc_NtkPo(pNtk2,iVar6);
      pAVar1 = (Abc_Aig_t *)pNtk_Qbf->pManFunc;
      pAVar3 = (pAVar4->field_6).pCopy;
      pAVar4 = Abc_ObjChild0Copy(pAVar4);
      pObj = Abc_AigXor(pAVar1,pAVar3,pAVar4);
      std::vector<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>::push_back(&Po_Pool,&pObj);
      iVar2 = pNtk2->vPos->nSize;
    }
    for (uVar7 = 0;
        uVar7 < (ulong)((long)Po_Pool.
                              super__Vector_base<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)Po_Pool.
                              super__Vector_base<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>.
                              _M_impl.super__Vector_impl_data._M_start >> 3); uVar7 = uVar7 + 1) {
      pObjA = Abc_NtkCreatePi(pNtk_Qbf);
      pAVar3 = Abc_NtkPo(pNtk2,(int)uVar7);
      pcVar5 = Abc_ObjName(pAVar3);
      pcVar5 = Bmatch_NameAddPrefix("y_",2,pcVar5);
      Abc_ObjAssignName(pObjA,pcVar5,"_*");
      operator_delete(pcVar5,1);
      pAVar3 = pObjA;
      pAVar1 = (Abc_Aig_t *)pNtk_Qbf->pManFunc;
      pAVar4 = Abc_AigConst1(pNtk_Qbf);
      pObj = Abc_AigMux(pAVar1,pAVar3,(Abc_Obj_t *)((ulong)pAVar4 ^ 1),
                        Po_Pool.super__Vector_base<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>.
                        _M_impl.super__Vector_impl_data._M_start[uVar7]);
      std::vector<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>::push_back(&Output_Pool,&pObj);
      std::vector<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>::push_back(&Control_Pool,&pObjA);
    }
    std::_Vector_base<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>::~_Vector_base
              (&Po_Pool.super__Vector_base<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>);
    return;
  }
  __assert_fail("Output_Pool.size() == 0 && Control_Pool.size() == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bmatch/bmatchQbf.cpp"
                ,0xd2,"void Bmatch_CreatePOMUXes(Abc_Ntk_t *, Abc_Ntk_t *, Abc_Ntk_t *)");
}

Assistant:

void Bmatch_CreatePOMUXes( Abc_Ntk_t * pNtk1, Abc_Ntk_t * pNtk2, Abc_Ntk_t * pNtk_Qbf )
{
    Abc_Obj_t * pPo, * pObj, * pObjA;
    int i, level = 1;
    char * pSuffix = new char[3]; pSuffix = "_*\0"; 
    vector< Abc_Obj_t * > Po_Pool;
    char * pName;

    assert( Output_Pool.size() == 0 && Control_Pool.size() == 0 );

    Abc_NtkForEachPo( pNtk1, pPo, i)
    {
        Po_Pool.push_back( Abc_ObjChild0Copy(pPo) );  
    }

    // Construct PO MUXes for Ntk2
    Abc_NtkForEachPo( pNtk2, pPo, i)
    {
        Bmatch_Construct_MUXes( Po_Pool, pPo, pNtk_Qbf, level );
        level = 1;
    }
    Po_Pool.clear();
    
    Abc_NtkForEachPo( pNtk2, pPo, i)
    {
        pObj = Abc_AigXor( (Abc_Aig_t *)pNtk_Qbf->pManFunc, pPo->pCopy, Abc_ObjChild0Copy(pPo) );
        Po_Pool.push_back( pObj );
    }

    for( int j = 0; j < Po_Pool.size(); ++j){
        pObjA = Abc_NtkCreatePi( pNtk_Qbf );

        pName = "y_";
        pName = Bmatch_NameAddPrefix(pName, 2, Abc_ObjName(Abc_NtkPo(pNtk2, j)));
        Abc_ObjAssignName( pObjA, pName, pSuffix );
        delete pName;

        pObj = Abc_AigMux( (Abc_Aig_t *)pNtk_Qbf->pManFunc, pObjA, Abc_ObjNot(Abc_AigConst1(pNtk_Qbf)), Po_Pool[j] );
        Output_Pool.push_back( pObj );
        Control_Pool.push_back( pObjA );
    }
}